

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottiemodel.h
# Opt level: O2

void __thiscall rlottie::internal::model::Repeater::Transform::~Transform(Transform *this)

{
  Property<float,_void>::destroy(&this->mEndOpacity);
  Property<float,_void>::destroy(&this->mStartOpacity);
  Property<VPointF,_void>::destroy(&this->mAnchor);
  Property<VPointF,_void>::destroy(&this->mPosition);
  Property<VPointF,_void>::destroy(&this->mScale);
  Property<float,_void>::destroy(&this->mRotation);
  return;
}

Assistant:

float   startOpacity(int frameNo) const
        {
            return mStartOpacity.value(frameNo) / 100;
        }